

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_bf7da7::cURLProgressHelper::UpdatePercentage
          (cURLProgressHelper *this,cm_curl_off_t value,cm_curl_off_t total,string *status)

{
  long lVar1;
  string local_58;
  byte local_31;
  long lStack_30;
  bool updated;
  long OldPercentage;
  string *status_local;
  cm_curl_off_t total_local;
  cm_curl_off_t value_local;
  cURLProgressHelper *this_local;
  
  lStack_30 = this->CurrentPercentage;
  OldPercentage = (long)status;
  status_local = (string *)total;
  total_local = value;
  value_local = (cm_curl_off_t)this;
  if (0 < total) {
    lVar1 = lround(((double)value / (double)total) * 100.0);
    this->CurrentPercentage = lVar1;
    if (100 < this->CurrentPercentage) {
      this->CurrentPercentage = 100;
    }
  }
  local_31 = lStack_30 != this->CurrentPercentage;
  if ((bool)local_31) {
    cmStrCat<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],long&,char_const(&)[12]>
              (&local_58,(char (*) [2])0x110762b,&this->Text,(char (*) [2])0x110ec64,
               &this->CurrentPercentage,(char (*) [12])"% complete]");
    std::__cxx11::string::operator=((string *)OldPercentage,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool UpdatePercentage(cm_curl_off_t value, cm_curl_off_t total,
                        std::string& status)
  {
    long OldPercentage = this->CurrentPercentage;

    if (total > 0) {
      this->CurrentPercentage = std::lround(
        static_cast<double>(value) / static_cast<double>(total) * 100.0);
      if (this->CurrentPercentage > 100) {
        // Avoid extra progress reports for unexpected data beyond total.
        this->CurrentPercentage = 100;
      }
    }

    bool updated = (OldPercentage != this->CurrentPercentage);

    if (updated) {
      status =
        cmStrCat("[", this->Text, " ", this->CurrentPercentage, "% complete]");
    }

    return updated;
  }